

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexConvexAlgorithm.cpp
# Opt level: O2

cbtScalar __thiscall
cbtConvexConvexAlgorithm::calculateTimeOfImpact
          (cbtConvexConvexAlgorithm *this,cbtCollisionObject *col0,cbtCollisionObject *col1,
          cbtDispatcherInfo *dispatchInfo,cbtManifoldResult *resultOut)

{
  cbtCollisionShape *pcVar1;
  float fVar2;
  bool bVar3;
  cbtScalar cVar4;
  cbtScalar cVar5;
  undefined1 in_ZMM0 [64];
  undefined1 auVar8 [56];
  undefined1 auVar6 [64];
  undefined1 extraout_var [56];
  undefined1 auVar7 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar11 [56];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  cbtVector3 cVar12;
  cbtGjkConvexCast ccd1;
  cbtSphereShape sphere1;
  CastResult result;
  cbtVoronoiSimplexSolver voronoiSimplex;
  float local_2e4;
  cbtGjkConvexCast local_2c8;
  cbtSphereShape local_2a8;
  CastResult local_260;
  cbtVoronoiSimplexSolver local_198;
  
  auVar11 = in_ZMM1._8_56_;
  auVar8 = in_ZMM0._8_56_;
  cVar12 = ::operator-(&(col0->m_interpolationWorldTransform).m_origin,
                       &(col0->m_worldTransform).m_origin);
  auVar9._0_8_ = cVar12.m_floats._8_8_;
  auVar9._8_56_ = auVar11;
  auVar6._0_8_ = cVar12.m_floats._0_8_;
  auVar6._8_56_ = auVar8;
  local_198._0_16_ = vmovlhps_avx(auVar6._0_16_,auVar9._0_16_);
  cVar4 = cbtVector3::length2((cbtVector3 *)&local_198);
  auVar8 = extraout_var;
  cVar12 = ::operator-(&(col1->m_interpolationWorldTransform).m_origin,
                       &(col1->m_worldTransform).m_origin);
  auVar10._0_8_ = cVar12.m_floats._8_8_;
  auVar10._8_56_ = auVar11;
  auVar7._0_8_ = cVar12.m_floats._0_8_;
  auVar7._8_56_ = auVar8;
  local_198._0_16_ = vmovlhps_avx(auVar7._0_16_,auVar10._0_16_);
  cVar5 = cbtVector3::length2((cbtVector3 *)&local_198);
  if (((cVar4 < col0->m_ccdMotionThreshold * col0->m_ccdMotionThreshold) &&
      (cVar5 < col1->m_ccdMotionThreshold * col1->m_ccdMotionThreshold)) || (disableCcd != false)) {
    local_2e4 = 1.0;
  }
  else {
    pcVar1 = col0->m_collisionShape;
    cbtSphereShape::cbtSphereShape(&local_2a8,col1->m_ccdSweptSphereRadius);
    local_260._vptr_CastResult = (_func_int **)&PTR_DebugDraw_01193fa8;
    local_260.m_fraction = 1e+18;
    local_260.m_debugDrawer = (cbtIDebugDraw *)0x0;
    local_260.m_allowedPenetration = 0.0;
    local_260.m_subSimplexCastMaxIterations = 0x20;
    local_198.m_equalVertexThreshold = 0.0001;
    local_260.m_subSimplexCastEpsilon = 0.0001;
    local_198.m_cachedBC.m_usedVertices._0_1_ = 0;
    cbtGjkConvexCast::cbtGjkConvexCast
              (&local_2c8,(cbtConvexShape *)pcVar1,(cbtConvexShape *)&local_2a8,&local_198);
    bVar3 = cbtGjkConvexCast::calcTimeOfImpact
                      (&local_2c8,&col0->m_worldTransform,&col0->m_interpolationWorldTransform,
                       &col1->m_worldTransform,&col1->m_interpolationWorldTransform,&local_260);
    if (bVar3) {
      if (local_260.m_fraction < col0->m_hitFraction) {
        col0->m_hitFraction = local_260.m_fraction;
      }
      if (local_260.m_fraction < col1->m_hitFraction) {
        col1->m_hitFraction = local_260.m_fraction;
      }
      local_2e4 = 1.0;
      fVar2 = local_260.m_fraction;
      if (1.0 <= local_260.m_fraction) {
        fVar2 = local_2e4;
      }
    }
    else {
      fVar2 = 1.0;
    }
    local_2e4 = fVar2;
    cbtConvexCast::~cbtConvexCast(&local_2c8.super_cbtConvexCast);
    cbtConvexShape::~cbtConvexShape((cbtConvexShape *)&local_2a8);
    pcVar1 = col1->m_collisionShape;
    cbtSphereShape::cbtSphereShape(&local_2a8,col0->m_ccdSweptSphereRadius);
    local_260._vptr_CastResult = (_func_int **)&PTR_DebugDraw_01193fa8;
    local_260.m_fraction = 1e+18;
    local_260.m_debugDrawer = (cbtIDebugDraw *)0x0;
    local_260.m_allowedPenetration = 0.0;
    local_260.m_subSimplexCastMaxIterations = 0x20;
    local_198.m_equalVertexThreshold = 0.0001;
    local_260.m_subSimplexCastEpsilon = 0.0001;
    local_198.m_cachedBC.m_usedVertices._0_1_ = 0;
    cbtGjkConvexCast::cbtGjkConvexCast
              (&local_2c8,(cbtConvexShape *)&local_2a8,(cbtConvexShape *)pcVar1,&local_198);
    bVar3 = cbtGjkConvexCast::calcTimeOfImpact
                      (&local_2c8,&col0->m_worldTransform,&col0->m_interpolationWorldTransform,
                       &col1->m_worldTransform,&col1->m_interpolationWorldTransform,&local_260);
    if (bVar3) {
      if (local_260.m_fraction < col0->m_hitFraction) {
        col0->m_hitFraction = local_260.m_fraction;
      }
      if (local_260.m_fraction < col1->m_hitFraction) {
        col1->m_hitFraction = local_260.m_fraction;
      }
      if (local_260.m_fraction < local_2e4) {
        local_2e4 = local_260.m_fraction;
      }
    }
    cbtConvexCast::~cbtConvexCast(&local_2c8.super_cbtConvexCast);
    cbtConvexShape::~cbtConvexShape((cbtConvexShape *)&local_2a8);
  }
  return local_2e4;
}

Assistant:

cbtScalar cbtConvexConvexAlgorithm::calculateTimeOfImpact(cbtCollisionObject* col0, cbtCollisionObject* col1, const cbtDispatcherInfo& dispatchInfo, cbtManifoldResult* resultOut)
{
	(void)resultOut;
	(void)dispatchInfo;
	///Rather then checking ALL pairs, only calculate TOI when motion exceeds threshold

	///Linear motion for one of objects needs to exceed m_ccdSquareMotionThreshold
	///col0->m_worldTransform,
	cbtScalar resultFraction = cbtScalar(1.);

	cbtScalar squareMot0 = (col0->getInterpolationWorldTransform().getOrigin() - col0->getWorldTransform().getOrigin()).length2();
	cbtScalar squareMot1 = (col1->getInterpolationWorldTransform().getOrigin() - col1->getWorldTransform().getOrigin()).length2();

	if (squareMot0 < col0->getCcdSquareMotionThreshold() &&
		squareMot1 < col1->getCcdSquareMotionThreshold())
		return resultFraction;

	if (disableCcd)
		return cbtScalar(1.);

	//An adhoc way of testing the Continuous Collision Detection algorithms
	//One object is approximated as a sphere, to simplify things
	//Starting in penetration should report no time of impact
	//For proper CCD, better accuracy and handling of 'allowed' penetration should be added
	//also the mainloop of the physics should have a kind of toi queue (something like Brian Mirtich's application of Timewarp for Rigidbodies)

	/// Convex0 against sphere for Convex1
	{
		cbtConvexShape* convex0 = static_cast<cbtConvexShape*>(col0->getCollisionShape());

		cbtSphereShape sphere1(col1->getCcdSweptSphereRadius());  //todo: allow non-zero sphere sizes, for better approximation
		cbtConvexCast::CastResult result;
		cbtVoronoiSimplexSolver voronoiSimplex;
		//SubsimplexConvexCast ccd0(&sphere,min0,&voronoiSimplex);
		///Simplification, one object is simplified as a sphere
		cbtGjkConvexCast ccd1(convex0, &sphere1, &voronoiSimplex);
		//ContinuousConvexCollision ccd(min0,min1,&voronoiSimplex,0);
		if (ccd1.calcTimeOfImpact(col0->getWorldTransform(), col0->getInterpolationWorldTransform(),
								  col1->getWorldTransform(), col1->getInterpolationWorldTransform(), result))
		{
			//store result.m_fraction in both bodies

			if (col0->getHitFraction() > result.m_fraction)
				col0->setHitFraction(result.m_fraction);

			if (col1->getHitFraction() > result.m_fraction)
				col1->setHitFraction(result.m_fraction);

			if (resultFraction > result.m_fraction)
				resultFraction = result.m_fraction;
		}
	}

	/// Sphere (for convex0) against Convex1
	{
		cbtConvexShape* convex1 = static_cast<cbtConvexShape*>(col1->getCollisionShape());

		cbtSphereShape sphere0(col0->getCcdSweptSphereRadius());  //todo: allow non-zero sphere sizes, for better approximation
		cbtConvexCast::CastResult result;
		cbtVoronoiSimplexSolver voronoiSimplex;
		//SubsimplexConvexCast ccd0(&sphere,min0,&voronoiSimplex);
		///Simplification, one object is simplified as a sphere
		cbtGjkConvexCast ccd1(&sphere0, convex1, &voronoiSimplex);
		//ContinuousConvexCollision ccd(min0,min1,&voronoiSimplex,0);
		if (ccd1.calcTimeOfImpact(col0->getWorldTransform(), col0->getInterpolationWorldTransform(),
								  col1->getWorldTransform(), col1->getInterpolationWorldTransform(), result))
		{
			//store result.m_fraction in both bodies

			if (col0->getHitFraction() > result.m_fraction)
				col0->setHitFraction(result.m_fraction);

			if (col1->getHitFraction() > result.m_fraction)
				col1->setHitFraction(result.m_fraction);

			if (resultFraction > result.m_fraction)
				resultFraction = result.m_fraction;
		}
	}

	return resultFraction;
}